

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::CodedInputStream::ReadLittleEndian64Fallback
          (CodedInputStream *this,uint64_t *value)

{
  bool bVar1;
  int iVar2;
  uint8_t **local_38;
  uint8_t *ptr;
  uint8_t bytes [8];
  size_t kSize;
  uint64_t *value_local;
  CodedInputStream *this_local;
  
  bytes[0] = '\b';
  bytes[1] = '\0';
  bytes[2] = '\0';
  bytes[3] = '\0';
  bytes[4] = '\0';
  bytes[5] = '\0';
  bytes[6] = '\0';
  bytes[7] = '\0';
  iVar2 = BufferSize(this);
  if (iVar2 < 8) {
    bVar1 = ReadRaw(this,&ptr,8);
    if (!bVar1) {
      return false;
    }
    local_38 = &ptr;
  }
  else {
    local_38 = (uint8_t **)this->buffer_;
    Advance(this,8);
  }
  ReadLittleEndian64FromArray((uint8_t *)local_38,value);
  return true;
}

Assistant:

bool CodedInputStream::ReadLittleEndian64Fallback(uint64_t* value) {
  constexpr size_t kSize = sizeof(*value);
  uint8_t bytes[kSize];

  const uint8_t* ptr;
  if (BufferSize() >= static_cast<int64_t>(kSize)) {
    // Fast path:  Enough bytes in the buffer to read directly.
    ptr = buffer_;
    Advance(kSize);
  } else {
    // Slow path:  Had to read past the end of the buffer.
    if (!ReadRaw(bytes, kSize)) return false;
    ptr = bytes;
  }
  ReadLittleEndian64FromArray(ptr, value);
  return true;
}